

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O0

double VBW::det4x4(double a11,double a12,double a13,double a14,double a21,double a22,double a23,
                  double a24,double a31,double a32,double a33,double a34,double a41,double a42,
                  double a43,double a44)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double m234;
  double m134;
  double m124;
  double m123;
  double m34;
  double m24;
  double m23;
  double m14;
  double m13;
  double m12;
  double a24_local;
  double a23_local;
  double a22_local;
  double a21_local;
  double a14_local;
  double a13_local;
  double a12_local;
  double a11_local;
  
  dVar1 = a21 * a12 + -(a11 * a22);
  dVar2 = a31 * a12 + -(a11 * a32);
  dVar3 = a41 * a12 + -(a11 * a42);
  dVar4 = a31 * a22 + -(a21 * a32);
  dVar5 = a41 * a22 + -(a21 * a42);
  dVar6 = a41 * a32 + -(a31 * a42);
  return -(dVar1 * a33 + dVar4 * a13 + -(dVar2 * a23)) * a44 +
         (dVar1 * a43 + dVar5 * a13 + -(dVar3 * a23)) * a34 +
         (dVar4 * a43 + dVar6 * a23 + -(dVar5 * a33)) * a14 +
         -((dVar2 * a43 + dVar6 * a13 + -(dVar3 * a33)) * a24);
}

Assistant:

inline double det4x4(
	double a11, double a12, double a13, double a14,
	double a21, double a22, double a23, double a24,               
	double a31, double a32, double a33, double a34,  
	double a41, double a42, double a43, double a44  
    ) {
	double m12 = a21*a12 - a11*a22;
	double m13 = a31*a12 - a11*a32;
	double m14 = a41*a12 - a11*a42;
	double m23 = a31*a22 - a21*a32;
	double m24 = a41*a22 - a21*a42;
	double m34 = a41*a32 - a31*a42;
	
	double m123 = m23*a13 - m13*a23 + m12*a33;
	double m124 = m24*a13 - m14*a23 + m12*a43;
	double m134 = m34*a13 - m14*a33 + m13*a43;
	double m234 = m34*a23 - m24*a33 + m23*a43;
	
	return (m234*a14 - m134*a24 + m124*a34 - m123*a44);
    }